

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  bool bVar1;
  FILE *pFVar2;
  ostream *poVar3;
  FilePath output_dir;
  FilePath output_file_path;
  GTestLog local_54;
  FilePath local_50;
  FilePath local_30;
  
  FilePath::FilePath(&local_30,output_file);
  FilePath::RemoveFileName(&local_50,&local_30);
  bVar1 = FilePath::CreateDirectoriesRecursively(&local_50);
  if (bVar1) {
    pFVar2 = fopen((output_file->_M_dataplus)._M_p,"w");
  }
  else {
    pFVar2 = (FILE *)0x0;
  }
  if (pFVar2 == (FILE *)0x0) {
    GTestLog::GTestLog(&local_54,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/build_O1/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                        output_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    GTestLog::~GTestLog(&local_54);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.pathname_._M_dataplus._M_p != &local_50.pathname_.field_2) {
    operator_delete(local_50.pathname_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.pathname_._M_dataplus._M_p != &local_30.pathname_.field_2) {
    operator_delete(local_30.pathname_._M_dataplus._M_p);
  }
  return (FILE *)pFVar2;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}